

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O0

bool __thiscall
HighsPrimalHeuristics::solveSubMip
          (HighsPrimalHeuristics *this,HighsLp *lp,HighsBasis *basis,double fixingRate,
          vector<double,_std::allocator<double>_> *colLower,
          vector<double,_std::allocator<double>_> *colUpper,HighsInt maxleaves,HighsInt maxnodes,
          HighsInt stallnodes)

{
  int iVar1;
  bool bVar2;
  HighsInt HVar3;
  undefined8 uVar4;
  pointer pHVar5;
  double *pdVar6;
  HighsMipAnalysis *this_00;
  size_type sVar7;
  size_type sVar8;
  long lVar9;
  HighsMipSolverData *in_RCX;
  ulong uVar10;
  HighsBasis *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  uint *in_RSI;
  HighsLp *in_RDI;
  HighsOptions *in_R8;
  undefined4 in_R9D;
  double in_XMM0_Qa;
  HighsSolution *extraout_XMM0_Qa;
  double dVar11;
  undefined1 auVar12 [16];
  uint in_stack_00000010;
  HighsInt oldNumImprovingSols;
  int64_t adjusted_lp_iterations;
  double adjustmentfactor;
  double numUnfixed;
  HighsPseudocostInitialization pscostinit;
  HighsMipSolver submipsolver;
  HighsSolution solution;
  double curr_abs_gap;
  bool allow_submip_log;
  HighsLp submip;
  HighsOptions submipoptions;
  HighsOptions *in_stack_fffffffffffff3b0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff3b8;
  pointer pdVar13;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff3c0;
  HighsOptions *in_stack_fffffffffffff3c8;
  HighsOptions *in_stack_fffffffffffff3d0;
  HighsInt in_stack_fffffffffffff3ec;
  HighsMipAnalysis *in_stack_fffffffffffff3f0;
  undefined8 in_stack_fffffffffffff408;
  undefined1 submip_00;
  HighsSolution *solution_00;
  uint in_stack_fffffffffffff418;
  uint in_stack_fffffffffffff41c;
  HighsInt in_stack_fffffffffffff440;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *in_stack_fffffffffffff448;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *in_stack_fffffffffffff450;
  double local_ba8;
  double local_ba0;
  double local_b98;
  int local_b8c [20];
  HighsInt in_stack_fffffffffffff4c4;
  HighsPseudocost *in_stack_fffffffffffff4c8;
  HighsPseudocostInitialization *in_stack_fffffffffffff4d0;
  HighsMipSolver local_a70;
  undefined1 local_880;
  undefined1 local_87f;
  double local_818;
  double local_810;
  string local_808 [35];
  undefined1 local_7e5;
  undefined8 local_6e0;
  string local_438 [128];
  double local_3b8;
  double local_300;
  undefined1 local_268;
  undefined1 local_146;
  undefined4 local_138;
  undefined4 local_124;
  undefined8 local_110;
  double local_108;
  undefined8 local_100;
  byte local_c8;
  undefined4 local_3c;
  double local_28;
  HighsBasis *local_20;
  uint *local_18;
  byte local_1;
  
  submip_00 = (undefined1)((ulong)in_stack_fffffffffffff408 >> 0x38);
  local_3c = in_R9D;
  local_28 = in_XMM0_Qa;
  local_20 = in_RDX;
  local_18 = in_RSI;
  HighsOptions::HighsOptions(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
  HighsLp::HighsLp(in_RDI,(HighsLp *)in_RCX);
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8);
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8);
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator=
            (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
  local_6e0 = 0;
  local_138 = local_3c;
  local_268 = 0;
  local_7e5 = 1;
  __buf = extraout_RDX;
  if ((*local_18 == 0xffffffca) && (local_18[1] == 0xffffff54)) {
    local_268 = 1;
    in_stack_fffffffffffff418 = *local_18;
    in_stack_fffffffffffff41c = local_18[1];
    highsBoolToString_abi_cxx11_(SUB81((ulong)in_RCX >> 0x38,0),(HighsInt)in_RCX);
    uVar4 = std::__cxx11::string::c_str();
    printf("HighsPrimalHeuristics::solveSubMip (%d, %d) with output_flag = %s\n",
           (ulong)in_stack_fffffffffffff418,(ulong)in_stack_fffffffffffff41c,uVar4);
    std::__cxx11::string::~string(local_808);
    __buf = extraout_RDX_00;
  }
  local_124 = 0;
  HighsTimer::read((HighsTimer *)(*(long *)in_RDI + 0x168),0,__buf,(ulong)in_stack_00000010);
  local_3b8 = local_3b8 - (double)extraout_XMM0_Qa;
  solution_00 = extraout_XMM0_Qa;
  pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x66ea58);
  local_300 = pHVar5->upper_limit;
  if ((*(byte *)(*(long *)in_RDI + 0xb0) & 1) == 0) {
    pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x66ea9b);
    dVar11 = pHVar5->upper_limit;
    pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x66eac3);
    local_810 = dVar11 - pHVar5->lower_bound;
    if ((local_810 == INFINITY) && (!NAN(local_810))) {
      pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x66eb0a);
      local_810 = ABS(pHVar5->lower_bound);
      if ((local_810 == INFINITY) && (!NAN(local_810))) {
        local_810 = 0.0;
      }
    }
    submip_00 = (undefined1)((ulong)dVar11 >> 0x38);
    local_110 = 0;
    pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x66eb70);
    dVar11 = pHVar5->feastol;
    local_818 = 1000.0;
    pdVar6 = std::max<double>(&local_810,&local_818);
    local_108 = dVar11 * *pdVar6;
  }
  if ((local_c8 & 1) == 0) {
    std::__cxx11::string::operator=(local_438,(string *)&::kHighsOnString_abi_cxx11_);
  }
  else {
    std::__cxx11::string::operator=(local_438,(string *)&::kHighsOffString_abi_cxx11_);
  }
  local_146 = 0;
  local_100 = 0x3fe999999999999a;
  HighsSolution::HighsSolution((HighsSolution *)in_stack_fffffffffffff3b0);
  local_880 = 0;
  local_87f = 0;
  if ((*(byte *)(*(long *)in_RDI + 0xb0) & 1) == 0) {
    HighsMipAnalysis::mipTimerStart(in_stack_fffffffffffff3f0,in_stack_fffffffffffff3ec);
  }
  HighsMipSolver::HighsMipSolver
            ((HighsMipSolver *)in_RDI,(HighsCallback *)in_RCX,in_R8,
             (HighsLp *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),solution_00,
             (bool)submip_00,in_stack_fffffffffffff440);
  local_a70.rootbasis = local_20;
  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
            ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x66ecf0);
  HighsPseudocostInitialization::HighsPseudocostInitialization
            (in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c4);
  local_a70.pscostinit = (HighsPseudocostInitialization *)(local_b8c + 1);
  pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x66ed35);
  local_a70.clqtableinit = &pHVar5->cliquetable;
  pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x66ed5e);
  local_a70.implicinit = &pHVar5->implications;
  HighsMipSolver::run((HighsMipSolver *)
                      submipsolver.solution_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  local_b8c[0] = local_a70.max_submip_level + 1;
  this_00 = (HighsMipAnalysis *)std::max<int>(local_b8c,(int *)(*(long *)in_RDI + 0xb8));
  *(undefined4 *)(*(long *)in_RDI + 0xb8) = *(undefined4 *)&this_00->timer_;
  if ((*(byte *)(*(long *)in_RDI + 0xb0) & 1) == 0) {
    HighsMipAnalysis::mipTimerStop(this_00,in_stack_fffffffffffff3ec);
  }
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                     0x66ee48);
  if (bVar2) {
    pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x66ee68);
    sVar7 = std::vector<int,_std::allocator<int>_>::size(&pHVar5->integral_cols);
    pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x66ee96);
    sVar8 = std::vector<int,_std::allocator<int>_>::size(&pHVar5->continuous_cols);
    lVar9 = sVar7 + sVar8;
    auVar12._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar12._0_8_ = lVar9;
    auVar12._12_4_ = 0x45300000;
    local_b98 = (auVar12._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0);
    HVar3 = HighsMipSolver::numCol(&local_a70);
    dVar11 = (double)HVar3;
    local_ba8 = 1.0;
    pdVar6 = std::max<double>(&local_ba8,&local_b98);
    dVar11 = dVar11 / *pdVar6;
    local_ba0 = dVar11;
    pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x66ef67);
    dVar11 = dVar11 * (double)pHVar5->total_lp_iterations;
    uVar10 = (ulong)dVar11;
    (in_RDI->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((uVar10 | (long)(dVar11 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f) +
                  (long)(in_RDI->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start);
    pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x66efd7);
    (in_RDI->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(pHVar5->total_repair_lp +
                  (long)(in_RDI->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start);
    pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x66f005);
    (in_RDI->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(pHVar5->total_repair_lp_feasible +
                  (long)(in_RDI->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
    pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x66f033);
    (in_RDI->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(pHVar5->total_repair_lp_iterations +
                  (long)(in_RDI->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((*(byte *)(*(long *)in_RDI + 0xb0) & 1) != 0) {
      in_stack_fffffffffffff3c0 =
           (vector<double,_std::allocator<double>_> *)
           std::max<long>((long *)&stack0xfffffffffffff448,(long *)&stack0xfffffffffffff440);
      pdVar13 = (in_stack_fffffffffffff3c0->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x66f0cd);
      pHVar5->num_nodes = (long)pdVar13 + pHVar5->num_nodes;
    }
  }
  if (local_a70.modelstatus_ == kInfeasible) {
    (in_RDI->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(local_28 +
                  (double)(in_RDI->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    *(int *)&(in_RDI->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish =
         *(int *)&(in_RDI->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
  }
  if ((local_a70.node_count_ < 2) && (local_a70.modelstatus_ == kInfeasible)) {
    local_1 = 0;
  }
  else {
    pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x66f154);
    iVar1 = pHVar5->numImprovingSols;
    if ((local_a70.modelstatus_ != kInfeasible) &&
       (bVar2 = std::vector<double,_std::allocator<double>_>::empty(in_stack_fffffffffffff3c0),
       !bVar2)) {
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x66f197);
      HighsMipSolverData::trySolution
                (in_RCX,(vector<double,_std::allocator<double>_> *)in_R8,in_stack_fffffffffffff41c);
    }
    pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x66f1c7);
    if (pHVar5->numImprovingSols != iVar1) {
      (in_RDI->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(local_28 +
                    (double)(in_RDI->col_lower_).super__Vector_base<double,_std::allocator<double>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
      *(int *)&(in_RDI->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage =
           *(int *)&(in_RDI->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage + 1;
    }
    local_1 = 1;
  }
  HighsPseudocostInitialization::~HighsPseudocostInitialization
            ((HighsPseudocostInitialization *)in_stack_fffffffffffff3b0);
  HighsMipSolver::~HighsMipSolver((HighsMipSolver *)in_stack_fffffffffffff3b0);
  HighsSolution::~HighsSolution((HighsSolution *)in_stack_fffffffffffff3b0);
  HighsLp::~HighsLp((HighsLp *)in_stack_fffffffffffff3b0);
  HighsOptions::~HighsOptions(in_stack_fffffffffffff3b0);
  return (bool)(local_1 & 1);
}

Assistant:

bool HighsPrimalHeuristics::solveSubMip(
    const HighsLp& lp, const HighsBasis& basis, double fixingRate,
    std::vector<double> colLower, std::vector<double> colUpper,
    HighsInt maxleaves, HighsInt maxnodes, HighsInt stallnodes) {
  HighsOptions submipoptions = *mipsolver.options_mip_;
  HighsLp submip = lp;

  // set bounds and restore integrality of the lp relaxation copy
  submip.col_lower_ = std::move(colLower);
  submip.col_upper_ = std::move(colUpper);
  submip.integrality_ = mipsolver.model_->integrality_;
  submip.offset_ = 0;

  // set limits
  submipoptions.mip_max_leaves = maxleaves;
  submipoptions.output_flag = false;

  const bool allow_submip_log = true;
  if (allow_submip_log && lp.num_col_ == -54 && lp.num_row_ == -172) {
    submipoptions.output_flag = true;
    printf(
        "HighsPrimalHeuristics::solveSubMip (%d, %d) with output_flag = %s\n",
        int(lp.num_col_), int(lp.num_row_),
        highsBoolToString(submipoptions.output_flag).c_str());
  }

  submipoptions.mip_max_nodes = maxnodes;
  submipoptions.mip_max_stall_nodes = stallnodes;
  submipoptions.mip_pscost_minreliable = 0;
  submipoptions.time_limit -= mipsolver.timer_.read();
  submipoptions.objective_bound = mipsolver.mipdata_->upper_limit;

  if (!mipsolver.submip) {
    double curr_abs_gap =
        mipsolver.mipdata_->upper_limit - mipsolver.mipdata_->lower_bound;

    if (curr_abs_gap == kHighsInf) {
      curr_abs_gap = fabs(mipsolver.mipdata_->lower_bound);
      if (curr_abs_gap == kHighsInf) curr_abs_gap = 0.0;
    }

    submipoptions.mip_rel_gap = 0.0;
    submipoptions.mip_abs_gap =
        mipsolver.mipdata_->feastol * std::max(curr_abs_gap, 1000.0);
  }

  // check if only root presolve is allowed
  if (submipoptions.mip_root_presolve_only)
    submipoptions.presolve = kHighsOffString;
  else
    submipoptions.presolve = kHighsOnString;
  submipoptions.mip_detect_symmetry = false;
  submipoptions.mip_heuristic_effort = 0.8;
  // setup solver and run it

  HighsSolution solution;
  solution.value_valid = false;
  solution.dual_valid = false;
  // Create HighsMipSolver instance for sub-MIP
  if (!mipsolver.submip)
    mipsolver.analysis_.mipTimerStart(kMipClockSubMipSolve);
  HighsMipSolver submipsolver(*mipsolver.callback_, submipoptions, submip,
                              solution, true, mipsolver.submip_level + 1);
  submipsolver.rootbasis = &basis;
  HighsPseudocostInitialization pscostinit(mipsolver.mipdata_->pseudocost, 1);
  submipsolver.pscostinit = &pscostinit;
  submipsolver.clqtableinit = &mipsolver.mipdata_->cliquetable;
  submipsolver.implicinit = &mipsolver.mipdata_->implications;
  // Solve the sub-MIP
  submipsolver.run();
  mipsolver.max_submip_level =
      std::max(submipsolver.max_submip_level + 1, mipsolver.max_submip_level);
  if (!mipsolver.submip) mipsolver.analysis_.mipTimerStop(kMipClockSubMipSolve);
  if (submipsolver.mipdata_) {
    double numUnfixed = mipsolver.mipdata_->integral_cols.size() +
                        mipsolver.mipdata_->continuous_cols.size();
    double adjustmentfactor = submipsolver.numCol() / std::max(1.0, numUnfixed);
    // (double)mipsolver.orig_model_->a_matrix_.value_.size();
    int64_t adjusted_lp_iterations =
        (size_t)(adjustmentfactor * submipsolver.mipdata_->total_lp_iterations);
    lp_iterations += adjusted_lp_iterations;
    total_repair_lp += submipsolver.mipdata_->total_repair_lp;
    total_repair_lp_feasible += submipsolver.mipdata_->total_repair_lp_feasible;
    total_repair_lp_iterations +=
        submipsolver.mipdata_->total_repair_lp_iterations;
    if (mipsolver.submip)
      mipsolver.mipdata_->num_nodes += std::max(
          int64_t{1}, int64_t(adjustmentfactor * submipsolver.node_count_));
  }

  if (submipsolver.modelstatus_ == HighsModelStatus::kInfeasible) {
    infeasObservations += fixingRate;
    ++numInfeasObservations;
  }
  if (submipsolver.node_count_ <= 1 &&
      submipsolver.modelstatus_ == HighsModelStatus::kInfeasible)
    return false;
  HighsInt oldNumImprovingSols = mipsolver.mipdata_->numImprovingSols;
  if (submipsolver.modelstatus_ != HighsModelStatus::kInfeasible &&
      !submipsolver.solution_.empty()) {
    mipsolver.mipdata_->trySolution(submipsolver.solution_,
                                    kSolutionSourceSubMip);
  }

  if (mipsolver.mipdata_->numImprovingSols != oldNumImprovingSols) {
    // remember fixing rate as good
    successObservations += fixingRate;
    ++numSuccessObservations;
  }

  return true;
}